

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::UpdateAxisColors(int axis_flag,ImPlotAxis *axis)

{
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImU32 IVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ImVec4 IVar9;
  ImVec4 col_label;
  ImVec4 col_grid;
  ImVec4 local_48;
  ImVec4 local_38;
  ImVec4 local_20;
  
  fVar2 = (GImPlot->Style).Colors[axis_flag].w;
  if ((fVar2 != -1.0) || (NAN(fVar2))) {
    pIVar1 = (GImPlot->Style).Colors + axis_flag;
    fVar2 = pIVar1->x;
    fVar4 = pIVar1->y;
    pIVar1 = (GImPlot->Style).Colors + axis_flag;
    uVar7._0_4_ = pIVar1->z;
    uVar7._4_4_ = pIVar1->w;
  }
  else {
    IVar9 = GetAutoColor(axis_flag);
    uVar7 = IVar9._8_8_;
    fVar2 = IVar9.x;
    fVar4 = IVar9.y;
  }
  local_48.z = (float)uVar7;
  local_48.w = (float)((ulong)uVar7 >> 0x20);
  fVar3 = (GImPlot->Style).Colors[(long)axis_flag + 1].w;
  local_48.x = fVar2;
  local_48.y = fVar4;
  if ((fVar3 != -1.0) || (NAN(fVar3))) {
    pIVar1 = (GImPlot->Style).Colors + (long)axis_flag + 1;
    fVar3 = pIVar1->x;
    fVar5 = pIVar1->y;
    pIVar1 = (GImPlot->Style).Colors + (long)axis_flag + 1;
    uVar8._0_4_ = pIVar1->z;
    uVar8._4_4_ = pIVar1->w;
  }
  else {
    IVar9 = GetAutoColor(axis_flag + 1);
    uVar8 = IVar9._8_8_;
    fVar3 = IVar9.x;
    fVar5 = IVar9.y;
  }
  local_38.z = (float)uVar8;
  local_38.w = (float)((ulong)uVar8 >> 0x20);
  local_38.x = fVar3;
  local_38.y = fVar5;
  IVar6 = ImGui::GetColorU32(&local_38);
  axis->ColorMaj = IVar6;
  local_20.w = (GImPlot->Style).MinorAlpha * local_38.w;
  local_20.x = local_38.x;
  local_20.y = local_38.y;
  local_20.z = local_38.z;
  IVar6 = ImGui::GetColorU32(&local_20);
  axis->ColorMin = IVar6;
  IVar6 = ImGui::GetColorU32(&local_48);
  axis->ColorTxt = IVar6;
  return;
}

Assistant:

void UpdateAxisColors(int axis_flag, ImPlotAxis* axis) {
    const ImVec4 col_label = GetStyleColorVec4(axis_flag);
    const ImVec4 col_grid  = GetStyleColorVec4(axis_flag + 1);
    axis->ColorMaj  = ImGui::GetColorU32(col_grid);
    axis->ColorMin  = ImGui::GetColorU32(col_grid*ImVec4(1,1,1,GImPlot->Style.MinorAlpha));
    axis->ColorTxt = ImGui::GetColorU32(col_label);
}